

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractproxymodel.cpp
# Opt level: O0

void __thiscall
QAbstractProxyModelPrivate::scheduleHeaderUpdate
          (QAbstractProxyModelPrivate *this,Orientation orientation)

{
  long lVar1;
  QAbstractProxyModel *pQVar2;
  int in_ESI;
  QAbstractProxyModelPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractProxyModel *q;
  bool isUpdateScheduled;
  bool local_29;
  undefined3 in_stack_ffffffffffffffe0;
  undefined4 uVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_29 = true;
  if (((byte)in_RDI->field_0xe0 >> 3 & 1) == 0) {
    local_29 = ((byte)in_RDI->field_0xe0 >> 2 & 1) != 0;
  }
  uVar3 = CONCAT13(local_29,in_stack_ffffffffffffffe0);
  if ((in_ESI == 1) && (((byte)in_RDI->field_0xe0 >> 3 & 1) == 0)) {
    in_RDI->field_0xe0 = in_RDI->field_0xe0 & 0xf7 | 8;
  }
  else {
    if ((in_ESI != 2) || (((byte)in_RDI->field_0xe0 >> 2 & 1) != 0)) goto LAB_00851fcc;
    in_RDI->field_0xe0 = in_RDI->field_0xe0 & 0xfb | 4;
  }
  if (local_29 == false) {
    pQVar2 = q_func(in_RDI);
    QMetaObject::
    invokeMethod<QAbstractProxyModelPrivate::scheduleHeaderUpdate(Qt::Orientation)::__0>
              ((ContextType *)in_RDI,(anon_class_8_1_8991fb9c_for_o *)CONCAT44(in_ESI,uVar3),
               (ConnectionType)((ulong)pQVar2 >> 0x20));
  }
LAB_00851fcc:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractProxyModelPrivate::scheduleHeaderUpdate(Qt::Orientation orientation)
{
    const bool isUpdateScheduled = updateHorizontalHeader || updateVerticalHeader;

    if (orientation == Qt::Horizontal && !updateHorizontalHeader)
        updateHorizontalHeader = true;
    else if (orientation == Qt::Vertical && !updateVerticalHeader)
        updateVerticalHeader = true;
    else
        return;

    if (!isUpdateScheduled) {
        Q_Q(QAbstractProxyModel);
        QMetaObject::invokeMethod(q, [this]() { emitHeaderDataChanged(); }, Qt::QueuedConnection);
    }
}